

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O0

void __thiscall
AI::HierarchicalTaskNetworkComponent::joinConversation(HierarchicalTaskNetworkComponent *this)

{
  World *this_00;
  GameMode *this_01;
  mapped_type *pmVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  TaskDatabase *local_18;
  TaskDatabase *tasks;
  HierarchicalTaskNetworkComponent *this_local;
  
  tasks = (TaskDatabase *)this;
  executeFinally(&(this->planner).plan,&this->state);
  this_00 = Component::getWorld(&this->super_Component);
  this_01 = World::getAuthGameMode(this_00);
  local_18 = GameMode::getAvailableTasks(this_01);
  this->currentGoal = JoinConversation;
  Actor::getName_abi_cxx11_(&local_38,(this->super_Component).owner);
  pmVar1 = std::
           map<AI::TaskIdentifier,_AI::Task,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_AI::Task>_>_>
           ::operator[](&local_18->tasks,&this->currentGoal);
  std::__cxx11::string::string((string *)&local_58,(string *)&pmVar1->debugName);
  log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string>
            ("[",&local_38,"] ","New goal: ",&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  updateTaskHistory(this);
  createPlan(this,this->currentGoal);
  std::
  map<AI::TaskIdentifier,_AI::Task,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_AI::Task>_>_>
  ::operator[](&local_18->tasks,&this->currentGoal);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::__cxx11::string::operator=((string *)&this->currentGoalName,pcVar2);
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::joinConversation()
{
	executeFinally(planner.plan, state);
	auto& tasks = static_cast<GameMode*>(getWorld()->getAuthGameMode())->getAvailableTasks();

	currentGoal = TaskIdentifier::JoinConversation;

#ifdef SHOW_PLANNER_INFORMATION_MESSAGES
	log("[", owner->getName(), "] ", "New goal: ", tasks.tasks[currentGoal].debugName);
#endif

	updateTaskHistory();		

	createPlan(currentGoal);

	currentGoalName = tasks.tasks[currentGoal].debugName.c_str();
}